

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_terrain.cxx
# Opt level: O2

void __thiscall level_mesh::separate_terrain(level_mesh *this,uint16_t texture)

{
  uint16_t uVar1;
  pointer pbVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  pointer pbVar5;
  long lVar6;
  uint16_t uVar7;
  b_model_instance *pbVar8;
  b_model_instance *pbVar9;
  byte bVar10;
  b_model_instance *instance;
  b_model local_a8;
  b_model_instance temp;
  
  bVar10 = 0;
  b_model_instance::b_model_instance(&temp,this->m_free_tag,0xffff);
  pbVar5 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = temp.sector;
  do {
    if (pbVar5 == pbVar2) {
      if (uVar7 != 0xffff) {
        instance = (b_model_instance *)operator_new(0x78);
        pbVar8 = &temp;
        pbVar9 = instance;
        for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
          uVar7 = pbVar8->model_id;
          uVar3 = pbVar8->sector;
          pbVar9->tag = pbVar8->tag;
          pbVar9->model_id = uVar7;
          pbVar9->sector = uVar3;
          pbVar8 = (b_model_instance *)((long)pbVar8 + (ulong)bVar10 * -0x10 + 8);
          pbVar9 = (b_model_instance *)((long)pbVar9 + (ulong)bVar10 * -0x10 + 8);
        }
        local_a8.field_3.m_instances =
             (b_model_instance **)
             ((long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
        local_a8.m_type = MT_TERRAIN;
        local_a8.m_locked = false;
        local_a8.m_num_instances = 1;
        std::vector<b_model,_std::allocator<b_model>_>::emplace_back<b_model>
                  (&this->m_models,&local_a8);
        std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::push_back
                  (&this->m_instances,&instance);
        this->m_free_tag = this->m_free_tag + 1;
      }
      return;
    }
    uVar3 = uVar7;
    uVar4 = temp.sector;
    if ((*(uint16_t *)&pbVar5->field_1 == texture) && (pbVar5->tag == 0xffffffff)) {
      pbVar5->tag = temp.tag;
      uVar1 = pbVar5->sector;
      uVar3 = uVar1;
      uVar4 = uVar1;
      if ((uVar7 != 0xffff) && (uVar3 = uVar7, uVar4 = temp.sector, uVar7 != uVar1)) {
        __assert_fail("temp.sector == it->sector",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_terrain.cxx"
                      ,0x84,"void level_mesh::separate_terrain(uint16_t)");
      }
    }
    temp.sector = uVar4;
    uVar7 = uVar3;
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

void level_mesh::separate_terrain(uint16_t texture)
{
	b_model_instance temp(m_free_tag, UINT16_MAX);
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		if (it->surface.texture != texture || it->tag != BAD_IDX)
			continue;
		it->tag = temp.tag;
		if (temp.sector == UINT16_MAX)
			temp.sector = it->sector;
		else
			xr_assert(temp.sector == it->sector);
	}
	if (temp.sector != UINT16_MAX) {
		b_model_instance* instance = new b_model_instance(temp);
		m_models.push_back(b_model(b_model::MT_TERRAIN, m_instances.size()));
		m_instances.push_back(instance);
		++m_free_tag;
	}
}